

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write<char,fmt::v9::appender>
                   (appender out,char *s,basic_format_specs<char> *specs,locale_ref param_4)

{
  basic_string_view<char> s_00;
  bool bVar1;
  size_t sVar2;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_RCX;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_RDX;
  basic_format_specs<char> *in_RSI;
  char *in_RDI;
  error_handler *in_stack_ffffffffffffff88;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff90;
  locale_ref local_60;
  locale_ref in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_18;
  
  bVar1 = check_cstring_type_spec<fmt::v9::detail::error_handler>
                    ((presentation_type)((ulong)in_stack_ffffffffffffff90 >> 0x30),
                     in_stack_ffffffffffffff88);
  if (bVar1) {
    puVar3 = &stack0xffffffffffffffa8;
    sVar2 = std::char_traits<char>::length((char_type *)0x1e06fa);
    *(size_t *)(puVar3 + 8) = sVar2;
    locale_ref::locale_ref(&local_60);
    s_00.size_ = in_stack_ffffffffffffffc0;
    s_00.data_ = in_RDI;
    local_18.container =
         (buffer<char> *)
         write<char,fmt::v9::appender>(in_RDX.container,s_00,in_RSI,in_stack_ffffffffffffffb0);
  }
  else {
    bit_cast<unsigned_long,_const_char_*,_0>((char **)&stack0xffffffffffffffd0);
    local_18.container =
         (buffer<char> *)
         write_ptr<char,fmt::v9::appender,unsigned_long>
                   (in_RCX.container,(unsigned_long)in_RSI,in_RDX.container);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_18.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
}